

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::paintEvent(QLineEdit *this,QPaintEvent *param_1)

{
  ushort uVar1;
  QLineEditPrivate *this_00;
  qreal qVar2;
  qreal qVar3;
  undefined1 *puVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  LayoutDirection LVar8;
  Alignment AVar9;
  Alignment AVar10;
  QPalette *pQVar11;
  QStyle *pQVar12;
  int extraout_var;
  int extraout_var_00;
  QBrush *pQVar13;
  QPen *pQVar14;
  QObject *object;
  QStyleSheetStyle *this_01;
  QWidgetLineControl *pQVar15;
  int extraout_var_01;
  int extraout_var_02;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long in_FS_OFFSET;
  QPen oldpen;
  undefined1 local_128 [16];
  undefined1 *local_118;
  QArrayDataPointer<char16_t> local_f0;
  QFontMetrics fm;
  QRect local_d0;
  QPainter p;
  QArrayDataPointer<char16_t> local_b8;
  QStyleOptionFrame panel;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = QWidget::palette(&this->super_QWidget);
  QPalette::QPalette((QPalette *)local_48,pQVar11);
  panel._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  panel.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&panel);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&panel);
  pQVar12 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,0x12,&panel,(QRect *)&p,this);
  pQVar12 = QWidget::style(&this->super_QWidget);
  local_d0 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,0x1a,&panel,this);
  local_128 = (undefined1  [16])QLineEditPrivate::effectiveTextMargins(this_00);
  local_d0 = QRect::marginsRemoved(&local_d0,(QMargins *)local_128);
  QPainter::setClipRect((QRect *)&p,(ClipOperation)&local_d0);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)&fm);
  bVar5 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
  if (bVar5) {
    QFontMetrics::boundingRect((QString *)&fm);
    iVar18 = extraout_var_01 - extraout_var;
  }
  else {
    QWidgetLineControl::text((QString *)&local_b8,(QWidgetLineControl *)this_00->control);
    QTextLayout::preeditAreaText();
    QStringBuilder<QString,_QString>::QStringBuilder
              ((QStringBuilder<QString,_QString> *)local_128,(QString *)&local_b8,(QString *)&oldpen
              );
    QStringBuilder<QString,_QString>::convertTo<QString>
              ((QString *)&local_f0,(QStringBuilder<QString,_QString> *)local_128);
    QFontMetrics::boundingRect((QString *)&fm);
    iVar18 = extraout_var_02 - extraout_var_00;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_128)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oldpen);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  iVar7 = QFontMetrics::height();
  if (iVar7 < iVar18 + 1) {
    iVar7 = iVar18 + 1;
  }
  LVar8 = QWidgetLineControl::layoutDirection((QWidgetLineControl *)this_00->control);
  AVar9 = QStyle::visualAlignment(LVar8,(Alignment)this_00->alignment);
  if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x20) {
    local_f0.d._4_4_ = local_d0.y1.m_i + 1;
  }
  else if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x40) {
    local_f0.d._4_4_ = (local_d0.y2.m_i - (iVar7 + 1)) + 1;
  }
  else {
    local_f0.d._4_4_ = (((local_d0.y2.m_i - iVar7) - local_d0.y1.m_i) + 2) / 2 + local_d0.y1.m_i;
  }
  this_00->vscroll = local_f0.d._4_4_;
  local_f0.d._0_4_ = local_d0.x1.m_i + 2;
  local_f0.ptr._0_4_ = local_d0.x2.m_i + -2;
  local_f0.ptr._4_4_ = local_f0.d._4_4_ + iVar7 + -1;
  bVar5 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
  if ((bVar5) && ((this_00->placeholderText).d.size != 0)) {
    bVar6 = QString::isRightToLeft();
    AVar10 = QStyle::visualAlignment((uint)bVar6,(Alignment)this_00->alignment);
    pQVar13 = QPalette::placeholderText((QPalette *)local_48);
    local_b8.d = *(Data **)(*(long *)pQVar13 + 8);
    local_b8.ptr = *(char16_t **)(*(long *)pQVar13 + 0x10);
    _oldpen = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = (QPen *)QPainter::pen();
    QPen::QPen(&oldpen,pQVar14);
    QPainter::setPen((QColor *)&p);
    QPainter::layoutDirection();
    LVar8 = (LayoutDirection)(QRect *)&p;
    QPainter::setLayoutDirection(LVar8);
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::elidedText((QString *)local_128,(TextElideMode)&fm,(int)this_00 + 0x2a8,1);
    QPainter::drawText((QRect *)&p,(int)&local_f0,
                       (QString *)
                       (ulong)(uint)AVar10.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                    super_QFlagsStorage<Qt::AlignmentFlag>.i,(QRect *)local_128);
    QPainter::setPen((QPen *)&p);
    QPainter::setLayoutDirection(LVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QPen::~QPen(&oldpen);
  }
  qVar2 = QWidgetLineControl::cursorToX((QWidgetLineControl *)this_00->control);
  qVar3 = QWidgetLineControl::naturalTextWidth((QWidgetLineControl *)this_00->control);
  iVar18 = (int)local_f0.d;
  iVar17 = (int)((double)((ulong)qVar3 & 0x8000000000000000 | 0x3fe0000000000000) + qVar3);
  iVar7 = ((int)local_f0.ptr - (int)local_f0.d) + 1;
  if (iVar17 < iVar7) {
    if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) == 4) {
      iVar16 = ((iVar17 + 1) - iVar7) / 2;
      this_00->hscroll = iVar16;
    }
    else if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                    super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) == 2) {
LAB_003ed976:
      iVar16 = (iVar17 - iVar7) + 2;
      this_00->hscroll = iVar16;
    }
    else {
      this_00->hscroll = 0;
      iVar16 = 0;
    }
  }
  else {
    iVar16 = (int)((double)((ulong)qVar2 & 0x8000000000000000 | 0x3fe0000000000000) + qVar2);
    iVar19 = this_00->hscroll;
    if (iVar16 - iVar19 < iVar7) {
      if ((iVar19 <= iVar16) || (iVar17 < iVar19)) {
        if ((iVar17 + 1) - iVar19 < iVar7) goto LAB_003ed976;
        iVar16 = 0;
        if (0 < iVar19) {
          iVar16 = iVar19;
        }
      }
    }
    else {
      iVar16 = (iVar16 - iVar7) + 1;
    }
    this_00->hscroll = iVar16;
  }
  iVar7 = 1;
  iVar19 = local_f0.d._4_4_ - this_00->control->m_ascent;
  iVar17 = QFontMetrics::ascent();
  local_b8.d = (Data *)CONCAT44(iVar17 + iVar19,iVar18 - iVar16);
  object = &QWidget::style(&this->super_QWidget)->super_QObject;
  this_01 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
  if (this_01 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::styleSheetPalette
              ((QStyleSheetStyle *)this_01,&this->super_QWidget,&panel.super_QStyleOption,
               (QPalette *)local_48);
  }
  QPalette::text((QPalette *)local_48);
  QPainter::setPen((QColor *)&p);
  pQVar15 = this_00->control;
  if (((pQVar15->m_text).d.size == 0) || (pQVar15->m_selend <= pQVar15->m_selstart)) {
    if ((this_00->field_0x27c & 4) == 0) goto LAB_003edad8;
    QWidgetLineControl::inputMask((QString *)local_128,(QWidgetLineControl *)pQVar15);
    if (local_118 == (undefined1 *)0x0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      goto LAB_003edad8;
    }
    uVar1 = *(ushort *)&this_00->control->field_0x50;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    if ((uVar1 & 4) != 0) goto LAB_003edad8;
    pQVar15 = this_00->control;
  }
  bVar5 = QPalette::operator!=(&pQVar15->m_palette,(QPalette *)local_48);
  iVar7 = 3;
  if ((bVar5) || ((this_00->control->m_palette).currentGroup != local_48._8_4_)) {
    QPalette::operator=(&this_00->control->m_palette,(QPalette *)local_48);
  }
LAB_003edad8:
  pQVar15 = this_00->control;
  iVar18 = iVar7;
  if (((this_00->field_0x27c & 4) != 0) && ((pQVar15->field_0x50 & 4) == 0)) {
    QWidgetLineControl::inputMask((QString *)local_128,(QWidgetLineControl *)pQVar15);
    puVar4 = local_118;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    iVar18 = iVar7 + 4;
    if (puVar4 != (undefined1 *)0x0) {
      iVar18 = iVar7;
    }
    pQVar15 = this_00->control;
  }
  pQVar12 = QWidget::style(&this->super_QWidget);
  iVar7 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x52,&panel,this);
  pQVar15->m_cursorWidth = iVar7;
  QWidgetLineControl::draw
            ((QWidgetLineControl *)this_00->control,&p,(QPoint *)&local_b8,&local_d0,iVar18);
  QFontMetrics::~QFontMetrics(&fm);
  QStyleOption::~QStyleOption(&panel.super_QStyleOption);
  QPalette::~QPalette((QPalette *)local_48);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::paintEvent(QPaintEvent *)
{
    Q_D(QLineEdit);
    QPainter p(this);
    QPalette pal = palette();

    QStyleOptionFrame panel;
    initStyleOption(&panel);
    style()->drawPrimitive(QStyle::PE_PanelLineEdit, &panel, &p, this);
    QRect r = style()->subElementRect(QStyle::SE_LineEditContents, &panel, this);
    r = r.marginsRemoved(d->effectiveTextMargins());
    p.setClipRect(r);

    QFontMetrics fm = fontMetrics();
    int fmHeight = 0;
    if (d->shouldShowPlaceholderText())
        fmHeight = fm.boundingRect(d->placeholderText).height();
    else
        fmHeight = fm.boundingRect(d->control->text() + d->control->preeditAreaText()).height();
    fmHeight = qMax(fmHeight, fm.height());

    Qt::Alignment va = QStyle::visualAlignment(d->control->layoutDirection(), QFlag(d->alignment));
    switch (va & Qt::AlignVertical_Mask) {
     case Qt::AlignBottom:
         d->vscroll = r.y() + r.height() - fmHeight - QLineEditPrivate::verticalMargin;
         break;
     case Qt::AlignTop:
         d->vscroll = r.y() + QLineEditPrivate::verticalMargin;
         break;
     default:
         //center
         d->vscroll = r.y() + (r.height() - fmHeight + 1) / 2;
         break;
    }
    QRect lineRect(r.x() + QLineEditPrivate::horizontalMargin, d->vscroll,
                   r.width() - 2 * QLineEditPrivate::horizontalMargin, fmHeight);

    if (d->shouldShowPlaceholderText()) {
        if (!d->placeholderText.isEmpty()) {
            const Qt::LayoutDirection layoutDir = d->placeholderText.isRightToLeft() ? Qt::RightToLeft : Qt::LeftToRight;
            const Qt::Alignment alignPhText = QStyle::visualAlignment(layoutDir, QFlag(d->alignment));
            const QColor col = pal.placeholderText().color();
            QPen oldpen = p.pen();
            p.setPen(col);
            Qt::LayoutDirection oldLayoutDir = p.layoutDirection();
            p.setLayoutDirection(layoutDir);

            const QString elidedText = fm.elidedText(d->placeholderText, Qt::ElideRight, lineRect.width());
            p.drawText(lineRect, alignPhText, elidedText);
            p.setPen(oldpen);
            p.setLayoutDirection(oldLayoutDir);
        }
    }

    int cix = qRound(d->control->cursorToX());

    // horizontal scrolling. d->hscroll is the left indent from the beginning
    // of the text line to the left edge of lineRect. we update this value
    // depending on the delta from the last paint event; in effect this means
    // the below code handles all scrolling based on the textline (widthUsed),
    // the line edit rect (lineRect) and the cursor position (cix).
    int widthUsed = qRound(d->control->naturalTextWidth()) + 1;
    if (widthUsed <= lineRect.width()) {
        // text fits in lineRect; use hscroll for alignment
        switch (va & ~(Qt::AlignAbsolute|Qt::AlignVertical_Mask)) {
        case Qt::AlignRight:
            d->hscroll = widthUsed - lineRect.width() + 1;
            break;
        case Qt::AlignHCenter:
            d->hscroll = (widthUsed - lineRect.width()) / 2;
            break;
        default:
            // Left
            d->hscroll = 0;
            break;
        }
    } else if (cix - d->hscroll >= lineRect.width()) {
        // text doesn't fit, cursor is to the right of lineRect (scroll right)
        d->hscroll = cix - lineRect.width() + 1;
    } else if (cix - d->hscroll < 0 && d->hscroll < widthUsed) {
        // text doesn't fit, cursor is to the left of lineRect (scroll left)
        d->hscroll = cix;
    } else if (widthUsed - d->hscroll < lineRect.width()) {
        // text doesn't fit, text document is to the left of lineRect; align
        // right
        d->hscroll = widthUsed - lineRect.width() + 1;
    } else {
        //in case the text is bigger than the lineedit, the hscroll can never be negative
        d->hscroll = qMax(0, d->hscroll);
    }

    // the y offset is there to keep the baseline constant in case we have script changes in the text.
    // Needs to be kept in sync with QLineEditPrivate::adjustedControlRect
    QPoint topLeft = lineRect.topLeft() - QPoint(d->hscroll, d->control->ascent() - fm.ascent());

    // draw text, selections and cursors
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle* cssStyle = qt_styleSheet(style())) {
        cssStyle->styleSheetPalette(this, &panel, &pal);
    }
#endif
    p.setPen(pal.text().color());

    int flags = QWidgetLineControl::DrawText;

#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || hasEditFocus())
#endif
    if (d->control->hasSelectedText() || (d->cursorVisible && !d->control->inputMask().isEmpty() && !d->control->isReadOnly())){
        flags |= QWidgetLineControl::DrawSelections;
        // Palette only used for selections/mask and may not be in sync
        if (d->control->palette() != pal
           || d->control->palette().currentColorGroup() != pal.currentColorGroup())
            d->control->setPalette(pal);
    }

    // Asian users see an IM selection text as cursor on candidate
    // selection phase of input method, so the ordinary cursor should be
    // invisible if we have a preedit string. another condition is when inputmask
    // isn't empty,we don't need draw cursor,because cursor and character overlapping
    // area is white.
    if (d->cursorVisible && !d->control->isReadOnly() && d->control->inputMask().isEmpty())
        flags |= QWidgetLineControl::DrawCursor;

    d->control->setCursorWidth(style()->pixelMetric(QStyle::PM_TextCursorWidth, &panel, this));
    d->control->draw(&p, topLeft, r, flags);

}